

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O0

void test_close_close_response_fails(void)

{
  cio_error cVar1;
  undefined1 local_38 [4];
  cio_error err;
  ws_frame frames [1];
  undefined6 uStack_10;
  uint16_t status;
  uint8_t data [10];
  
  stack0xffffffffffffffee = 0x4220646f6f470000;
  frames[0]._28_2_ = cio_be16toh(1000);
  stack0xffffffffffffffee = CONCAT62(uStack_10,frames[0]._28_2_);
  local_38 = (undefined1  [4])0x8;
  err = CIO_SUCCESS;
  frames[0]._0_8_ = &frames[0].field_0x1e;
  frames[0].data = (void *)0xa;
  frames[0].data_length._0_1_ = 1;
  frames[0].data_length._1_1_ = 0;
  cio_buffered_stream_write_fake.custom_fake = bs_write_error;
  serialize_frames((ws_frame *)local_38,1);
  cVar1 = cio_websocket_read_message(ws,read_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Could not start reading a message!",0x373,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)read_handler_fake.call_count,"read_handler was not called",0x375,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)read_handler_fake.arg0_val,
             "websocket parameter of read_handler not correct",0x376,UNITY_DISPLAY_STYLE_INT);
  if (read_handler_fake.arg1_val == (void *)0x0) {
    UnityAssertEqualNumber
              (1,(long)read_handler_fake.arg2_val,"error parameter of read_handler not CIO_SUCCESS",
               0x378,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)on_error_fake.call_count,"error callback was not called",0x37a,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((UNITY_INT)ws,(UNITY_INT)on_error_fake.arg0_val,
               "websocket parameter of error handler not correct",0x37b,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (-0x5a,(long)on_error_fake.arg1_val,"error code in error handler not correct",0x37c,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)on_control_fake.call_count,
               "control callback was called for last close frame",0x37e,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((UNITY_INT)ws,(UNITY_INT)on_control_fake.arg0_val,
               "websocket parameter of on_control handler not correct",0x37f,UNITY_DISPLAY_STYLE_INT
              );
    UnityAssertEqualNumber
              (8,(ulong)on_control_fake.arg1_val,
               "frame type parameter of on_control handler not correct",0x380,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (10,(ulong)on_control_fake.arg3_val,
               "data length parameter of on_control handler not correct",0x381,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualMemory
              (&frames[0].field_0x1e,read_back_buffer,10,1,"echoed data in close frame not correct",
               899,UNITY_ARRAY_TO_ARRAY);
    return;
  }
  UnityFail("context of read handler not NULL",0x377);
}

Assistant:

static void test_close_close_response_fails(void)
{
	uint8_t data[] = {0x0, 0x0, 'G', 'o', 'o', 'd', ' ', 'B', 'y', 'e'};

	uint16_t status = cio_be16toh((uint16_t)CIO_WEBSOCKET_CLOSE_NORMAL);
	memcpy(data, &status, sizeof(status));

	struct ws_frame frames[] = {
	    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = true, .rsv = false},
	};

	cio_buffered_stream_write_fake.custom_fake = bs_write_error;

	serialize_frames(frames, ARRAY_SIZE(frames));

	enum cio_error err = cio_websocket_read_message(ws, read_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");

	TEST_ASSERT_EQUAL_MESSAGE(1, read_handler_fake.call_count, "read_handler was not called");
	TEST_ASSERT_EQUAL_MESSAGE(ws, read_handler_fake.arg0_val, "websocket parameter of read_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg1_val, "context of read handler not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_EOF, read_handler_fake.arg2_val, "error parameter of read_handler not CIO_SUCCESS");

	TEST_ASSERT_EQUAL_MESSAGE(1, on_error_fake.call_count, "error callback was not called");
	TEST_ASSERT_EQUAL_MESSAGE(ws, on_error_fake.arg0_val, "websocket parameter of error handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_MESSAGE_TOO_LONG, on_error_fake.arg1_val, "error code in error handler not correct");

	TEST_ASSERT_EQUAL_MESSAGE(1, on_control_fake.call_count, "control callback was called for last close frame");
	TEST_ASSERT_EQUAL_MESSAGE(ws, on_control_fake.arg0_val, "websocket parameter of on_control handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_WEBSOCKET_CLOSE_FRAME, on_control_fake.arg1_val, "frame type parameter of on_control handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(data), on_control_fake.arg3_val, "data length parameter of on_control handler not correct");

	TEST_ASSERT_EQUAL_MEMORY_MESSAGE(data, read_back_buffer, sizeof(data), "echoed data in close frame not correct");
}